

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O3

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CRelativeConditionalWrapper::ToConditional
          (CRelativeConditionalWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  CJumpConditionalStatement *pCVar5;
  CLabelStatement *pCVar6;
  long *in_RCX;
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_98;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_90;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_88;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_80;
  CJumpConditionalStatement *local_78;
  CLabel local_70;
  CLabel local_50;
  
  local_78 = (CJumpConditionalStatement *)operator_new(0x30);
  sVar4 = (labelTrue->label)._M_string_length;
  local_80._M_head_impl = (CExpression *)(labelTrue->label).field_2._M_allocated_capacity;
  (labelTrue->label).field_2._M_allocated_capacity = 0;
  local_90._M_head_impl = *(CExpression **)((long)&(labelTrue->label).field_2 + 8);
  *(undefined8 *)((long)&(labelTrue->label).field_2 + 8) = 0;
  pCVar6 = (CLabelStatement *)operator_new(0x28);
  paVar1 = &local_50.label.field_2;
  pcVar3 = (labelFalse->label)._M_dataplus._M_p;
  local_50.label._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (labelFalse->label)._M_string_length);
  CLabelStatement::CLabelStatement(pCVar6,&local_50);
  local_98._M_head_impl = pCVar6;
  pCVar6 = (CLabelStatement *)operator_new(0x28);
  paVar2 = &local_70.label.field_2;
  local_70.label._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,*in_RCX,in_RCX[1] + *in_RCX);
  CLabelStatement::CLabelStatement(pCVar6,&local_70);
  pCVar5 = local_78;
  local_88._M_head_impl = pCVar6;
  CJumpConditionalStatement::CJumpConditionalStatement
            (local_78,(TLogicOperator)sVar4,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_80,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_90,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_98,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_88);
  (this->super_CConditionalWrapper).super_ISubtreeWrapper._vptr_ISubtreeWrapper =
       (_func_int **)pCVar5;
  if (local_88._M_head_impl != (CLabelStatement *)0x0) {
    (*((local_88._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
  }
  local_88._M_head_impl = (CLabelStatement *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.label._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.label._M_dataplus._M_p);
  }
  if (local_98._M_head_impl != (CLabelStatement *)0x0) {
    (*((local_98._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
  }
  local_98._M_head_impl = (CLabelStatement *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.label._M_dataplus._M_p);
  }
  if (local_90._M_head_impl != (CExpression *)0x0) {
    (*((local_90._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_90._M_head_impl = (CExpression *)0x0;
  if (local_80._M_head_impl != (CExpression *)0x0) {
    (*((local_80._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement>
    CRelativeConditionalWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        return std::move( std::unique_ptr<const CStatement>(
                new CJumpConditionalStatement(
                        operatorType,
                        std::move( operandLeft ),
                        std::move( operandRight ),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelTrue ))),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelFalse )))
                )
        ));
    }